

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int type)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  void *ptr;
  void *local_70;
  int *local_68;
  size_t local_60;
  int local_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int local_40;
  int local_3c;
  size_t local_38;
  void *local_30;
  
  uVar2 = h * w;
  (*this->_vptr_ModelBin[2])(&local_70,this,(ulong)uVar2,type);
  if ((local_70 == (void *)0x0) || ((long)local_3c * local_38 == 0)) {
    __return_storage_ptr__->data = local_70;
    __return_storage_ptr__->refcount = local_68;
    __return_storage_ptr__->elemsize = local_60;
    __return_storage_ptr__->elempack = local_58;
    __return_storage_ptr__->allocator = local_50;
    __return_storage_ptr__->dims = local_48;
    __return_storage_ptr__->w = iStack_44;
    __return_storage_ptr__->h = local_40;
    __return_storage_ptr__->c = local_3c;
    __return_storage_ptr__->cstep = local_38;
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + 1;
      UNLOCK();
    }
  }
  else if (local_40 * iStack_44 * local_3c == uVar2) {
    if ((local_48 == 3) && (local_38 != (long)local_40 * (long)iStack_44)) {
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = local_60;
      __return_storage_ptr__->elempack = local_58;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 2;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = h;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)(int)uVar2;
      if (uVar2 == 0) {
        pvVar4 = (void *)0x0;
      }
      else {
        uVar3 = local_60 * (long)(int)uVar2 + 3 & 0xfffffffffffffffc;
        local_30 = (void *)0x0;
        iVar1 = posix_memalign(&local_30,0x10,uVar3 + 4);
        pvVar4 = (void *)0x0;
        if (iVar1 == 0) {
          pvVar4 = local_30;
        }
        __return_storage_ptr__->data = pvVar4;
        __return_storage_ptr__->refcount = (int *)((long)pvVar4 + uVar3);
        *(undefined4 *)((long)pvVar4 + uVar3) = 1;
        pvVar4 = local_30;
      }
      if (0 < local_3c) {
        lVar5 = 0;
        do {
          memcpy((void *)((long)((int)lVar5 * local_40 * iStack_44) * local_60 + (long)pvVar4),
                 (void *)(local_38 * lVar5 * local_60 + (long)local_70),
                 (long)(local_40 * iStack_44) * local_60);
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_3c);
      }
    }
    else {
      __return_storage_ptr__->data = local_70;
      __return_storage_ptr__->refcount = local_68;
      __return_storage_ptr__->elemsize = local_60;
      __return_storage_ptr__->elempack = local_58;
      __return_storage_ptr__->allocator = local_50;
      __return_storage_ptr__->dims = local_48;
      __return_storage_ptr__->w = iStack_44;
      __return_storage_ptr__->h = local_40;
      __return_storage_ptr__->c = local_3c;
      __return_storage_ptr__->cstep = local_38;
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + 1;
        UNLOCK();
      }
      __return_storage_ptr__->dims = 2;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = h;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)(int)uVar2;
    }
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      if (local_50 == (Allocator *)0x0) {
        if (local_70 != (void *)0x0) {
          free(local_70);
        }
      }
      else {
        (**(code **)(*(long *)local_50 + 0x18))();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}